

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::BuiltinDeserializer<std::shared_ptr<int>,_void>::deserialize<InputStream>
               (shared_ptr<int> *opt,InputStream *istream)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int *__p;
  uint8_t discriminator;
  char local_19;
  
  std::istream::read((char *)istream->stream,(long)&local_19);
  if (local_19 == '\0') {
    this = (opt->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (opt->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    (opt->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
  }
  else {
    __p = (int *)operator_new(4);
    *__p = 0;
    std::__shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>::reset<int>
              (&opt->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>,__p);
    std::istream::read((char *)istream->stream,
                       (long)(opt->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }